

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall Liby::http::HttpClient::get(HttpClient *this,Request *request,ReplyHandler *handler)

{
  bool bVar1;
  pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_> local_e0;
  ReplyHandler *local_20;
  ReplyHandler *handler_local;
  Request *request_local;
  HttpClient *this_local;
  
  local_20 = handler;
  handler_local = (ReplyHandler *)request;
  request_local = (Request *)this;
  std::make_pair<Liby::http::Request_const&,std::function<void(Liby::http::Reply&)>const&>
            (&local_e0,request,handler);
  std::__cxx11::
  list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
  ::emplace_back<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>
            ((list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
              *)&this->requestLists_,&local_e0);
  std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>::~pair(&local_e0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->http_conn_);
  if (bVar1) {
    sendRequest(this);
  }
  return;
}

Assistant:

void Liby::http::HttpClient::get(const Request &request,
                                 const ReplyHandler &handler) {
    requestLists_.emplace_back(std::make_pair(request, handler));
    if (http_conn_)
        sendRequest();
}